

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

int __thiscall
Function::clone(Function *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  unique_ptr<Function,_std::default_delete<Function>_> *__u;
  unique_ptr<Value,_std::default_delete<Value>_> *this_00;
  undefined8 in_R9;
  int iVar1;
  Context *in_stack_ffffffffffffffb0;
  _Elt_pointer in_stack_ffffffffffffffb8;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_stack_ffffffffffffffc0;
  _Elt_pointer in_stack_ffffffffffffffc8;
  
  __u = (unique_ptr<Function,_std::default_delete<Function>_> *)(__fn + 0xc);
  this_00 = (unique_ptr<Value,_std::default_delete<Value>_> *)(__fn + 0x10);
  Context::clone((Context *)&stack0xffffffffffffff98,__fn + 0x38,__child_stack,__flags,__arg,in_R9,
                 this);
  std::
  make_unique<Function,TypeName_const&,std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>const&,std::shared_ptr<BlockNode>const&,Context>
            ((TypeName *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (shared_ptr<BlockNode> *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::unique_ptr<Value,std::default_delete<Value>>::
  unique_ptr<Function,std::default_delete<Function>,void>(this_00,__u);
  std::unique_ptr<Function,_std::default_delete<Function>_>::~unique_ptr
            ((unique_ptr<Function,_std::default_delete<Function>_> *)this);
  iVar1 = (int)this;
  Context::~Context((Context *)0x17d4ed);
  return iVar1;
}

Assistant:

std::unique_ptr<Value> Function::clone() const
{
  return std::make_unique<Function>(returnType_, arguments_, body_, context_.clone());
}